

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O0

void adios2::helper::HandshakeWriter
               (Comm *comm,size_t *appID,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *fullAddresses,string *name,string *engineName,int basePort,int channelsPerRank,
               int maxRanksPerNode,int maxAppsPerNode)

{
  bool bVar1;
  reference pvVar2;
  unsigned_long uVar3;
  FileFStream *this;
  char *pcVar4;
  char *destination;
  size_t __n;
  size_t sourceCount;
  unsigned_long *in_RSI;
  int in_stack_00000008;
  FileFStream ipstream;
  FileFStream lockstream;
  string globalAddressesStr;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *i_2;
  iterator __end4;
  iterator __begin4;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *__range4;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  j;
  int i_1;
  json globalAddressesJson;
  vector<char,_std::allocator<char>_> globalAddressesChar;
  vector<char,_std::allocator<char>_> localAddressesChar;
  string localAddressesStr;
  json localAddressesJson;
  string addr;
  int i;
  string numAppsString;
  FileFStream numWrite;
  vector<char,_std::allocator<char>_> numAppsChar;
  size_t size;
  FileFStream numRead;
  FileFStream lockWrite;
  FileFStream lockCheck;
  string ip;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ips;
  string engineLockFilename;
  string engineFilename;
  string globalLockFilename;
  string globalFilename;
  int mpiSize;
  int mpiRank;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffe8a8;
  FileFStream *in_stack_ffffffffffffe8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe8b8;
  reference in_stack_ffffffffffffe8c0;
  undefined7 in_stack_ffffffffffffe8c8;
  undefined1 in_stack_ffffffffffffe8cf;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffe8d0;
  undefined4 in_stack_ffffffffffffe8d8;
  undefined4 in_stack_ffffffffffffe8dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe8f0;
  unsigned_long *in_stack_ffffffffffffe8f8;
  Comm *in_stack_ffffffffffffe900;
  int rankDestination;
  Comm *in_stack_ffffffffffffe918;
  Comm *comm_00;
  FileFStream *in_stack_ffffffffffffe920;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffe938;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffe940;
  FileFStream *in_stack_ffffffffffffe970;
  size_t in_stack_ffffffffffffe9a8;
  size_t in_stack_ffffffffffffe9b0;
  char *in_stack_ffffffffffffe9b8;
  FileFStream *in_stack_ffffffffffffe9c0;
  undefined1 in_stack_ffffffffffffe9de;
  undefined1 in_stack_ffffffffffffe9df;
  parser_callback_t *in_stack_ffffffffffffe9e0;
  char **in_stack_ffffffffffffe9e8;
  undefined1 in_stack_ffffffffffffead2;
  undefined1 in_stack_ffffffffffffead3;
  Mode in_stack_ffffffffffffead4;
  string *in_stack_ffffffffffffead8;
  FileFStream *in_stack_ffffffffffffeae0;
  error_handler_t in_stack_ffffffffffffeb7c;
  undefined1 in_stack_ffffffffffffeb82;
  char in_stack_ffffffffffffeb83;
  int in_stack_ffffffffffffeb84;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffeb88;
  undefined1 local_1030 [144];
  reference local_fa0;
  undefined1 local_f98 [20];
  int local_f84;
  undefined1 local_f6a [32];
  allocator<char> local_f4a;
  undefined1 local_f49;
  string local_f30 [48];
  string local_f00 [32];
  string local_ee0 [32];
  string local_ec0 [32];
  string local_ea0 [32];
  string local_e80 [36];
  int local_e5c;
  allocator local_171;
  string local_170 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [36];
  int local_34;
  int local_30;
  unsigned_long *local_10;
  
  local_10 = in_RSI;
  local_30 = Comm::Rank((Comm *)0x98cd59);
  local_34 = Comm::Size((Comm *)0x98cd6d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,".socket",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,".socket.lock",&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe8dc,in_stack_ffffffffffffe8d8),
                 (char *)in_stack_ffffffffffffe8d0);
  std::operator+(in_stack_ffffffffffffe8b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe8dc,in_stack_ffffffffffffe8d8),
                 (char *)in_stack_ffffffffffffe8d0);
  std::operator+(in_stack_ffffffffffffe8b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8b0);
  std::operator+(in_stack_ffffffffffffe8b8,(char *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_138);
  AvailableIpAddresses_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"127.0.0.1",&local_171);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffe8c0);
  if (!bVar1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_150,0);
    std::__cxx11::string::operator=(local_170,(string *)pvVar2);
  }
  if (local_30 == 0) {
    adios2::transport::FileFStream::FileFStream(in_stack_ffffffffffffe920,in_stack_ffffffffffffe918)
    ;
    do {
      adios2::transport::FileFStream::Open
                (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,in_stack_ffffffffffffead4,
                 (bool)in_stack_ffffffffffffead3,(bool)in_stack_ffffffffffffead2);
      adios2::transport::FileFStream::Close(in_stack_ffffffffffffe970);
    } while( true );
  }
  uVar3 = Comm::BroadcastValue<unsigned_long>
                    (in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8,
                     (int)((ulong)in_stack_ffffffffffffe8f0 >> 0x20));
  *local_10 = uVar3;
  for (local_e5c = 0; local_e5c < in_stack_00000008; local_e5c = local_e5c + 1) {
    std::operator+((char *)in_stack_ffffffffffffe8f8,in_stack_ffffffffffffe8f0);
    std::operator+(in_stack_ffffffffffffe8b8,(char *)in_stack_ffffffffffffe8b0);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffe8e8);
    std::operator+(in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e0);
    std::operator+(in_stack_ffffffffffffe8b8,(char *)in_stack_ffffffffffffe8b0);
    std::__cxx11::string::~string(local_ea0);
    std::__cxx11::string::~string(local_f00);
    std::__cxx11::string::~string(local_ec0);
    std::__cxx11::string::~string(local_ee0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8);
    std::__cxx11::string::~string(local_e80);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  basic_json<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_ffffffffffffe8b0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffe8a8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump(in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb84,in_stack_ffffffffffffeb83,
         (bool)in_stack_ffffffffffffeb82,in_stack_ffffffffffffeb7c);
  this = (FileFStream *)(long)(in_stack_00000008 << 6);
  local_f49 = 0;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_ffffffffffffe8d0,CONCAT17(in_stack_ffffffffffffe8cf,in_stack_ffffffffffffe8c8)
             ,(value_type_conflict3 *)in_stack_ffffffffffffe8c0,
             (allocator_type *)in_stack_ffffffffffffe8b8);
  std::allocator<char>::~allocator(&local_f4a);
  pcVar4 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x98d897);
  destination = (char *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::size();
  memcpy(pcVar4,destination,__n);
  rankDestination = (int)((ulong)pcVar4 >> 0x20);
  sourceCount = (long)in_stack_00000008 * (long)local_34 * 0x40;
  local_f6a[1] = 0;
  comm_00 = (Comm *)local_f6a;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_ffffffffffffe8d0,CONCAT17(in_stack_ffffffffffffe8cf,in_stack_ffffffffffffe8c8)
             ,(value_type_conflict3 *)in_stack_ffffffffffffe8c0,
             (allocator_type *)in_stack_ffffffffffffe8b8);
  std::allocator<char>::~allocator((allocator<char> *)local_f6a);
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x98d94e);
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x98d971);
  Comm::GatherArrays<char>((Comm *)this,(char *)comm_00,sourceCount,destination,rankDestination);
  if (local_30 == 0) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_ffffffffffffe8b0,in_stack_ffffffffffffe8a8);
    for (local_f84 = 0; local_f84 < local_34; local_f84 = local_f84 + 1) {
      local_fa0 = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)(local_f6a + 2),
                             (long)local_f84 * (long)in_stack_00000008 * 0x40);
      std::
      function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
      ::function((function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
                  *)in_stack_ffffffffffffe8b0,in_stack_ffffffffffffe8a8);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::parse<char*>(in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9e0,
                     (bool)in_stack_ffffffffffffe9df,(bool)in_stack_ffffffffffffe9de);
      std::
      function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
      ::~function((function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
                   *)0x98da45);
      local_1030._104_8_ = local_f98;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)in_stack_ffffffffffffe8b8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)in_stack_ffffffffffffe8b8);
      while( true ) {
        bVar1 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator!=<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)in_stack_ffffffffffffe8b0,in_stack_ffffffffffffe8a8);
        if (!bVar1) break;
        in_stack_ffffffffffffe8c0 =
             nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*(in_stack_ffffffffffffe938);
        local_1030._32_8_ = in_stack_ffffffffffffe8c0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::push_back(in_stack_ffffffffffffe940,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)in_stack_ffffffffffffe938);
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)in_stack_ffffffffffffe8b0);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)in_stack_ffffffffffffe8b0);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::dump(in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb84,in_stack_ffffffffffffeb83,
           (bool)in_stack_ffffffffffffeb82,in_stack_ffffffffffffeb7c);
    adios2::transport::FileFStream::FileFStream(this,comm_00);
    adios2::transport::FileFStream::Open
              (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,in_stack_ffffffffffffead4,
               (bool)in_stack_ffffffffffffead3,(bool)in_stack_ffffffffffffead2);
    adios2::transport::FileFStream::FileFStream(this,comm_00);
    adios2::transport::FileFStream::Open
              (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,in_stack_ffffffffffffead4,
               (bool)in_stack_ffffffffffffead3,(bool)in_stack_ffffffffffffead2);
    in_stack_ffffffffffffe8b0 = (FileFStream *)local_1030;
    std::__cxx11::string::data();
    std::__cxx11::string::size();
    adios2::transport::FileFStream::Write
              (in_stack_ffffffffffffe9c0,in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b0,
               in_stack_ffffffffffffe9a8);
    adios2::transport::FileFStream::Close(in_stack_ffffffffffffe970);
    adios2::transport::FileFStream::Close(in_stack_ffffffffffffe970);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    remove(pcVar4);
    adios2::transport::FileFStream::~FileFStream(in_stack_ffffffffffffe8b0);
    adios2::transport::FileFStream::~FileFStream(in_stack_ffffffffffffe8b0);
    std::__cxx11::string::~string((string *)local_1030);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_ffffffffffffe8b0);
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffe8c0);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffe8c0);
  std::__cxx11::string::~string(local_f30);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffe8c0);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void HandshakeWriter(Comm const &comm, size_t &appID, std::vector<std::string> &fullAddresses,
                     const std::string &name, const std::string &engineName, const int basePort,
                     const int channelsPerRank, const int maxRanksPerNode, const int maxAppsPerNode)
{

    int mpiRank = comm.Rank();
    int mpiSize = comm.Size();

    const std::string globalFilename = ".socket";
    const std::string globalLockFilename = ".socket.lock";

    const std::string engineFilename = name + "." + engineName;
    const std::string engineLockFilename = name + "." + engineName + ".lock";

    // Get IP address
    auto ips = helper::AvailableIpAddresses();
    std::string ip = "127.0.0.1";
    if (ips.empty() == false)
    {
        ip = ips[0];
    }

    // Check total number of writer apps
    if (mpiRank == 0)
    {
        transport::FileFStream lockCheck(comm);
        while (true)
        {
            try
            {
                lockCheck.Open(globalLockFilename, Mode::Read);
                lockCheck.Close();
            }
            catch (...)
            {
                break;
            }
        }
        transport::FileFStream lockWrite(comm);
        lockWrite.Open(globalLockFilename, Mode::Write);

        transport::FileFStream numRead(comm);
        try
        {
            numRead.Open(globalFilename, Mode::Read);
            auto size = numRead.GetSize();
            std::vector<char> numAppsChar(size);
            numRead.Read(numAppsChar.data(), numAppsChar.size());
            appID = 1 + stoi(std::string(numAppsChar.begin(), numAppsChar.end()));
            numRead.Close();
        }
        catch (...)
        {
        }
        transport::FileFStream numWrite(comm);
        numWrite.Open(globalFilename, Mode::Write);
        std::string numAppsString = std::to_string(appID);
        numWrite.Write(numAppsString.data(), numAppsString.size());
        numWrite.Close();

        lockWrite.Close();
        remove(globalLockFilename.c_str());
    }

    appID = comm.BroadcastValue(appID);

    // Make full addresses
    for (int i = 0; i < channelsPerRank; ++i)
    {
        std::string addr =
            "tcp://" + ip + ":" +
            std::to_string(basePort + (100 * appID) +
                           (mpiRank % 1000) * static_cast<unsigned long>(channelsPerRank) + i) +
            "\0";
        fullAddresses.push_back(addr);
    }
    nlohmann::json localAddressesJson = fullAddresses;
    std::string localAddressesStr = localAddressesJson.dump();
    std::vector<char> localAddressesChar(64 * channelsPerRank, '\0');
    std::memcpy(localAddressesChar.data(), localAddressesStr.c_str(), localAddressesStr.size());
    std::vector<char> globalAddressesChar(static_cast<size_t>(64) * channelsPerRank * mpiSize,
                                          '\0');
    comm.GatherArrays(localAddressesChar.data(), 64 * channelsPerRank, globalAddressesChar.data());

    // Writing handshake file
    if (mpiRank == 0)
    {
        nlohmann::json globalAddressesJson;
        for (int i = 0; i < mpiSize; ++i)
        {
            auto j = nlohmann::json::parse(
                &globalAddressesChar[static_cast<size_t>(i) * static_cast<size_t>(64) *
                                     static_cast<size_t>(channelsPerRank)]);
            for (auto &i : j)
            {
                globalAddressesJson.push_back(i);
            }
        }
        std::string globalAddressesStr = globalAddressesJson.dump();
        transport::FileFStream lockstream(comm);
        lockstream.Open(engineLockFilename, Mode::Write);
        transport::FileFStream ipstream(comm);
        ipstream.Open(engineFilename, Mode::Write);
        ipstream.Write(globalAddressesStr.data(), globalAddressesStr.size());
        ipstream.Close();
        lockstream.Close();
        remove(engineLockFilename.c_str());
    }
}